

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component_widget.cpp
# Opt level: O0

void __thiscall
lsim::gui::ComponentWidget::ComponentWidget(ComponentWidget *this,ModelComponent *component_model)

{
  allocator local_19;
  ModelComponent *local_18;
  ModelComponent *component_model_local;
  ComponentWidget *this_local;
  
  this->m_component = component_model;
  this->m_border = true;
  local_18 = component_model;
  component_model_local = (ModelComponent *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->m_tooltip,"",&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  Transform::Transform(&this->m_to_circuit);
  Point::Point(&this->m_half_size,0.0,0.0);
  Point::Point(&this->m_aabb_min);
  Point::Point(&this->m_aabb_max);
  this->m_icon = (ComponentIcon *)0x0;
  std::
  function<void_(lsim::gui::CircuitEditor_*,_const_lsim::gui::ComponentWidget_*,_lsim::Transform)>::
  function(&this->m_draw_callback,(nullptr_t)0x0);
  std::
  unordered_map<unsigned_long,_lsim::Point,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_lsim::Point>_>_>
  ::unordered_map(&this->m_endpoints);
  build_transform(this);
  return;
}

Assistant:

ComponentWidget::ComponentWidget(ModelComponent* component_model) :
	m_component(component_model),
	m_border(true),
	m_tooltip(""),
	m_half_size(0.0f, 0.0f),
	m_icon(nullptr),
	m_draw_callback(nullptr) {
	build_transform();
}